

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderPrimitiveCoverage.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderPrimitiveCoverage::initBufferObjects
          (TessellationShaderPrimitiveCoverage *this)

{
  deUint32 dVar1;
  RenderContext *pRVar2;
  GLfloat extraout_var;
  undefined1 local_78 [8];
  GLfloat vertices [24];
  Functions *gl;
  TessellationShaderPrimitiveCoverage *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  vertices[0x16] = (GLfloat)(*pRVar2->_vptr_RenderContext[3])();
  vertices[0x17] = extraout_var;
  memcpy(local_78,&DAT_02b1edb0,0x60);
  (**(code **)(vertices._88_8_ + 0x6c8))(1,&this->m_bo_id);
  dVar1 = (**(code **)(vertices._88_8_ + 0x800))();
  glu::checkError(dVar1,"glGenBuffers() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x212);
  (**(code **)(vertices._88_8_ + 0x40))(0x8892,this->m_bo_id);
  dVar1 = (**(code **)(vertices._88_8_ + 0x800))();
  glu::checkError(dVar1,"glBindBuffer() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x215);
  (**(code **)(vertices._88_8_ + 0x150))(0x8892,0x60,local_78,0x88e4);
  dVar1 = (**(code **)(vertices._88_8_ + 0x800))();
  glu::checkError(dVar1,"glBufferData() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x218);
  (**(code **)(vertices._88_8_ + 0x19f0))(0,4,0x1406,0,0,0);
  dVar1 = (**(code **)(vertices._88_8_ + 0x800))();
  glu::checkError(dVar1,"glVertexAttribPointer() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x221);
  (**(code **)(vertices._88_8_ + 0x610))(0);
  dVar1 = (**(code **)(vertices._88_8_ + 0x800))();
  glu::checkError(dVar1,"glEnableVertexAttribArray() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x224);
  return;
}

Assistant:

void TessellationShaderPrimitiveCoverage::initBufferObjects(void)
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set up an array of vertices that will be fed into vertex shader */
	glw::GLfloat vertices[6 /* vertices */ * m_n_components /* components */] = {
		-1.0f, 1.0f, 0.0f, 1.0f, -1.0f, -1.0f, 0.0f, 1.0f, 1.0f,
		-1.0f, 0.0f, 1.0f,		 /* A half-screen triangle (patch) (CCW) is defined until here */
		1.0f,  1.0f, 0.0f, 1.0f, /* A full screen quad (patch) (CCW) is defined until here */
		-1.0f, 1.0f, 0.0f, 1.0f, 1.0f,  -1.0f, 0.0f, 1.0f /* A full screen quad (2 triangles) (CCW) is defined until here */
	};

	/* Configure a buffer object to hold vertex data */
	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed!");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed!");

	gl.bufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed!");

	/* Configure "position" vertex attribute array and enable it */
	gl.vertexAttribPointer(0,		 /* index */
						   4,		 /* size */
						   GL_FLOAT, /* type */
						   GL_FALSE, /* normalized */
						   0,		 /* stride */
						   0);		 /* pointer */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribPointer() failed!");

	gl.enableVertexAttribArray(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray() failed!");
}